

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::fastPresolveLoop(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  Result RVar1;
  HPresolve *in_RSI;
  HPresolve *in_RDI;
  double dVar2;
  Result __result_4;
  Result __result_3;
  Result __result_2;
  Result __result_1;
  Result __result;
  HighsPostsolveStack *in_stack_00000030;
  HPresolve *in_stack_00000038;
  uint in_stack_ffffffffffffffd0;
  Result in_stack_ffffffffffffffe0;
  Result in_stack_ffffffffffffffe4;
  HPresolve *postsolve_stack_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  postsolve_stack_00 = in_RDI;
  while( true ) {
    storeCurrentProblemSize(in_RDI);
    in_stack_ffffffffffffffe4 =
         removeRowSingletons(in_RSI,(HighsPostsolveStack *)
                                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (in_stack_ffffffffffffffe4 != kOk) {
      return in_stack_ffffffffffffffe4;
    }
    in_stack_ffffffffffffffe0 = presolveChangedRows(in_stack_00000038,in_stack_00000030);
    if (in_stack_ffffffffffffffe0 != kOk) {
      return in_stack_ffffffffffffffe0;
    }
    RVar1 = removeDoubletonEquations
                      ((HPresolve *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (HighsPostsolveStack *)postsolve_stack_00);
    if (RVar1 != kOk) {
      return RVar1;
    }
    RVar1 = presolveColSingletons(in_stack_00000038,in_stack_00000030);
    if (RVar1 != kOk) break;
    RVar1 = presolveChangedCols(in_stack_00000038,in_stack_00000030);
    if (RVar1 != kOk) {
      return RVar1;
    }
    dVar2 = problemSizeReduction((HPresolve *)(ulong)in_stack_ffffffffffffffd0);
    if (dVar2 <= 0.01) {
      return kOk;
    }
  }
  return RVar1;
}

Assistant:

HPresolve::Result HPresolve::fastPresolveLoop(
    HighsPostsolveStack& postsolve_stack) {
  do {
    storeCurrentProblemSize();

    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedRows(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(removeDoubletonEquations(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveColSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedCols(postsolve_stack));

  } while (problemSizeReduction() > 0.01);

  return Result::kOk;
}